

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O2

void Fra_CnfNodeAddToSolver(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  int iVar1;
  Vec_Ptr_t *vFrontier;
  Aig_Obj_t *pNode;
  Vec_Ptr_t *vSuper;
  void *pvVar2;
  int i;
  
  if (pOld == (Aig_Obj_t *)0x0 && pNew == (Aig_Obj_t *)0x0) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                  ,0xf3,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((pOld == (Aig_Obj_t *)0x0) ||
      (*(long *)(*(long *)((long)(pOld->field_5).pData + 0x90) + (long)pOld->Id * 8) != 0)) &&
     ((pNew == (Aig_Obj_t *)0x0 ||
      (*(long *)(*(long *)((long)(pNew->field_5).pData + 0x90) + (long)pNew->Id * 8) != 0)))) {
    return;
  }
  vFrontier = Vec_PtrAlloc(100);
  if (pOld != (Aig_Obj_t *)0x0) {
    Fra_ObjAddToFrontier(p,pOld,vFrontier);
  }
  if (pNew != (Aig_Obj_t *)0x0) {
    Fra_ObjAddToFrontier(p,pNew,vFrontier);
  }
  i = 0;
  while( true ) {
    if (vFrontier->nSize <= i) {
      free(vFrontier->pArray);
      free(vFrontier);
      return;
    }
    pNode = (Aig_Obj_t *)Vec_PtrEntry(vFrontier,i);
    if (*(int *)(*(long *)((long)(pNode->field_5).pData + 0x98) + (long)pNode->Id * 4) == 0) {
      __assert_fail("Fra_ObjSatNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                    ,0xff,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    if (*(long *)(*(long *)((long)(pNode->field_5).pData + 0x90) + (long)pNode->Id * 8) != 0) {
      __assert_fail("Fra_ObjFaninVec(pNode) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                    ,0x100,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    iVar1 = Aig_ObjIsMuxType(pNode);
    if (iVar1 == 0) {
      vSuper = Fra_CollectSuper(pNode,1);
      for (iVar1 = 0; iVar1 < vSuper->nSize; iVar1 = iVar1 + 1) {
        pvVar2 = Vec_PtrEntry(vSuper,iVar1);
        Fra_ObjAddToFrontier(p,(Aig_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe),vFrontier);
      }
      Fra_AddClausesSuper(p,pNode,vSuper);
    }
    else {
      vSuper = Vec_PtrAlloc(4);
      Vec_PtrPushUnique(vSuper,(void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 8)
                                       & 0xfffffffffffffffe));
      Vec_PtrPushUnique(vSuper,(void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 8)
                                       & 0xfffffffffffffffe));
      Vec_PtrPushUnique(vSuper,(void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) +
                                                  0x10) & 0xfffffffffffffffe));
      Vec_PtrPushUnique(vSuper,(void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) +
                                                  0x10) & 0xfffffffffffffffe));
      for (iVar1 = 0; iVar1 < vSuper->nSize; iVar1 = iVar1 + 1) {
        pvVar2 = Vec_PtrEntry(vSuper,iVar1);
        Fra_ObjAddToFrontier(p,(Aig_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe),vFrontier);
      }
      Fra_AddClausesMux(p,pNode);
    }
    if (vSuper->nSize < 2) break;
    *(Vec_Ptr_t **)(*(long *)((long)(pNode->field_5).pData + 0x90) + (long)pNode->Id * 8) = vSuper;
    i = i + 1;
  }
  __assert_fail("Vec_PtrSize(vFanins) > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                ,0x113,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Fra_CnfNodeAddToSolver( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{ 
    Vec_Ptr_t * vFrontier, * vFanins;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    assert( pOld || pNew );
    // quit if CNF is ready
    if ( (!pOld || Fra_ObjFaninVec(pOld)) && (!pNew || Fra_ObjFaninVec(pNew)) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    if ( pOld ) Fra_ObjAddToFrontier( p, pOld, vFrontier );
    if ( pNew ) Fra_ObjAddToFrontier( p, pNew, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Fra_ObjSatNum(pNode) );
        assert( Fra_ObjFaninVec(pNode) == NULL );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            vFanins = Vec_PtrAlloc( 4 );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, vFanins, pFanin, k )
                Fra_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Fra_AddClausesMux( p, pNode );
        }
        else
        {
            vFanins = Fra_CollectSuper( pNode, fUseMuxes );
            Vec_PtrForEachEntry( Aig_Obj_t *, vFanins, pFanin, k )
                Fra_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Fra_AddClausesSuper( p, pNode, vFanins );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
        Fra_ObjSetFaninVec( pNode, vFanins );
    }
    Vec_PtrFree( vFrontier );
}